

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::str::str(str *this,object *o)

{
  bool bVar1;
  PyObject **ppPVar2;
  error_already_set *this_00;
  PyObject *local_58;
  handle local_30;
  PyObject *local_28;
  handle local_20;
  handle *local_18;
  object *o_local;
  str *this_local;
  
  local_28 = (o->super_handle).m_ptr;
  local_18 = &o->super_handle;
  o_local = &this->super_object;
  bVar1 = check_((handle)local_28);
  if (bVar1) {
    local_30 = object::release((object *)local_18);
    ppPVar2 = pybind11::handle::ptr(&local_30);
    local_58 = *ppPVar2;
  }
  else {
    ppPVar2 = pybind11::handle::ptr(local_18);
    local_58 = raw_str(*ppPVar2);
  }
  pybind11::handle::handle(&local_20,local_58);
  object::object(&this->super_object,local_20.m_ptr);
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

str(const char *c, size_t n)
        : object(PyUnicode_FromStringAndSize(c, (ssize_t) n), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate string object!");
    }